

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O1

void enlarge(parse *p,sopno size)

{
  sop *psVar1;
  
  if (p->ssize < size) {
    psVar1 = (sop *)realloc(p->strip,size * 8);
    if (psVar1 == (sop *)0x0) {
      if (p->error == 0) {
        p->error = 0xc;
      }
      p->next = nuls;
      p->end = nuls;
    }
    else {
      p->strip = psVar1;
      p->ssize = size;
    }
  }
  return;
}

Assistant:

static void
enlarge(p, size)
struct parse *p;
sopno size;
{
	sop *sp;

	if (p->ssize >= size)
		return;

	sp = (sop *)realloc(p->strip, (size_t)size*sizeof(sop));
	if (sp == NULL) {
		seterr(p, REG_ESPACE);
		return;
	}
	p->strip = sp;
	p->ssize = size;
}